

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O3

void run_threads(uint n_threads,os_thread_t *threads,context *ctx)

{
  os_thread_t *thread;
  ulong uVar1;
  ulong uVar2;
  
  if (n_threads != 0) {
    uVar2 = (ulong)n_threads;
    thread = threads;
    uVar1 = uVar2;
    do {
      os_thread_create(thread,(os_thread_attr_t *)0x0,ctx->worker,ctx);
      thread = thread + 1;
      ctx = ctx + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    if (n_threads != 0) {
      do {
        os_thread_join(threads,(void **)0x0);
        threads = threads + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

static void
run_threads(unsigned n_threads, os_thread_t *threads, struct context *ctx)
{
	for (unsigned i = 0; i < n_threads; ++i)
		os_thread_create(&threads[i], NULL, ctx[i].worker,
					&ctx[i]);

	for (unsigned i = 0; i < n_threads; ++i)
		os_thread_join(&threads[i], NULL);
}